

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_seq.c
# Opt level: O0

void jas_matrix_clip(jas_matrix_t *matrix,jas_seqent_t minval,jas_seqent_t maxval)

{
  jas_matind_t jVar1;
  size_t sVar2;
  jas_matind_t rowstep;
  jas_seqent_t *data;
  jas_seqent_t *rowstart;
  jas_seqent_t v;
  jas_matind_t j;
  jas_matind_t i;
  jas_seqent_t maxval_local;
  jas_seqent_t minval_local;
  jas_matrix_t *matrix_local;
  
  jVar1 = jas_matrix_numrows(matrix);
  if ((0 < jVar1) && (jVar1 = jas_matrix_numcols(matrix), 0 < jVar1)) {
    if (matrix->rows_ == (jas_seqent_t **)0x0) {
      __assert_fail("matrix->rows_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_seq.c"
                    ,0x133,"void jas_matrix_clip(jas_matrix_t *, jas_seqent_t, jas_seqent_t)");
    }
    sVar2 = jas_matrix_rowstep(matrix);
    data = *matrix->rows_;
    for (j = matrix->numrows_; 0 < j; j = j + -1) {
      v = matrix->numcols_;
      rowstep = (jas_matind_t)data;
      for (; 0 < v; v = v + -1) {
        if (*(long *)rowstep < minval) {
          *(jas_seqent_t *)rowstep = minval;
        }
        else if (maxval < *(long *)rowstep) {
          *(jas_seqent_t *)rowstep = maxval;
        }
        rowstep = rowstep + 8;
      }
      data = data + sVar2;
    }
  }
  return;
}

Assistant:

void jas_matrix_clip(jas_matrix_t *matrix, jas_seqent_t minval,
  jas_seqent_t maxval)
{
	jas_matind_t i;
	jas_matind_t j;
	jas_seqent_t v;
	jas_seqent_t *rowstart;
	jas_seqent_t *data;
	jas_matind_t rowstep;

	if (jas_matrix_numrows(matrix) > 0 && jas_matrix_numcols(matrix) > 0) {
		assert(matrix->rows_);
		rowstep = jas_matrix_rowstep(matrix);
		for (i = matrix->numrows_, rowstart = matrix->rows_[0]; i > 0; --i,
		  rowstart += rowstep) {
			data = rowstart;
			for (j = matrix->numcols_, data = rowstart; j > 0; --j,
			  ++data) {
				v = *data;
				if (v < minval) {
					*data = minval;
				} else if (v > maxval) {
					*data = maxval;
				}
			}
		}
	}
}